

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O0

void __thiscall Centaurus::Stage2Runner::thread_runner_impl(Stage2Runner *this)

{
  uint64_t *src;
  uint64_t *data;
  Stage2Runner *this_local;
  
  this->m_current_bank = -1;
  while( true ) {
    src = (uint64_t *)acquire_bank(this);
    if (src == (uint64_t *)0x0) break;
    reduce_bank(this,src);
    release_bank(this);
  }
  return;
}

Assistant:

void thread_runner_impl()
  {
    m_current_bank = -1;
    while (true) {
      uint64_t *data = reinterpret_cast<uint64_t*>(acquire_bank());
      if (data == NULL) break;
      reduce_bank(data);
      release_bank();
    }
  }